

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stat_update_tree(nni_stat *stat,nni_mtx **mtxp)

{
  byte bVar1;
  nni_stat_item *pnVar2;
  nni_stat_info *pnVar3;
  char *__s2;
  int iVar4;
  nni_mtx *pnVar5;
  anon_union_8_5_0a23ca40_for_si_u aVar6;
  char *pcVar7;
  nni_time nVar8;
  nni_stat *stat_00;
  
  pnVar2 = stat->s_item;
  pnVar3 = pnVar2->si_info;
  if ((pnVar3->field_0x18 & 4) == 0) {
    if (*mtxp == (nni_mtx *)0x0) goto LAB_00116db2;
    nni_mtx_unlock(*mtxp);
    pnVar5 = (nni_mtx *)0x0;
  }
  else {
    if (pnVar2->si_mtx == (nni_mtx *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/stats.c",
                0x126,"item->si_mtx != NULL");
    }
    pnVar5 = *mtxp;
    if (pnVar5 == pnVar2->si_mtx) goto LAB_00116db2;
    if (pnVar5 != (nni_mtx *)0x0) {
      nni_mtx_unlock(pnVar5);
    }
    nni_mtx_lock(pnVar2->si_mtx);
    pnVar5 = pnVar2->si_mtx;
  }
  *mtxp = pnVar5;
LAB_00116db2:
  switch(pnVar3->si_type) {
  case NNG_STAT_SCOPE:
  case NNG_STAT_ID:
    (stat->s_val).sv_id = (pnVar2->si_u).sv_id;
    break;
  case NNG_STAT_LEVEL:
  case NNG_STAT_COUNTER:
    if ((pnVar3->field_0x18 & 1) == 0) {
      aVar6.sv_atomic.v = *(nni_atomic_u64 *)&pnVar2->si_u;
    }
    else {
      aVar6.sv_number = nni_atomic_get64(&(pnVar2->si_u).sv_atomic);
    }
    (stat->s_val).sv_value = (uint64_t)aVar6;
    break;
  case NNG_STAT_STRING:
    nni_mtx_lock(&stats_val_lock);
    __s2 = (stat->s_val).sv_string;
    pcVar7 = (pnVar2->si_u).sv_string;
    bVar1 = pnVar3->field_0x18;
    if (((pcVar7 != (char *)0x0 & bVar1 >> 1) == 1) &&
       ((__s2 == (char *)0x0 || (iVar4 = strcmp(pcVar7,__s2), iVar4 != 0)))) {
      pcVar7 = nni_strdup(pcVar7);
      (stat->s_val).sv_string = pcVar7;
      nni_strfree(__s2);
    }
    else if ((bVar1 & 2) == 0) {
      (stat->s_val).sv_string = pcVar7;
    }
    else {
      nni_strfree(__s2);
      (stat->s_val).sv_value = 0;
    }
    nni_mtx_unlock(&stats_val_lock);
    break;
  case NNG_STAT_BOOLEAN:
    (stat->s_val).sv_bool = (pnVar2->si_u).sv_bool;
  }
  nVar8 = nni_clock();
  stat->s_timestamp = nVar8;
  for (stat_00 = (nni_stat *)nni_list_first(&stat->s_children); stat_00 != (nni_stat *)0x0;
      stat_00 = (nni_stat *)nni_list_next(&stat->s_children,stat_00)) {
    stat_update_tree(stat_00,mtxp);
  }
  return;
}

Assistant:

static void
stat_update_tree(nni_stat *stat, nni_mtx **mtxp)
{
	nni_stat *child;
	stat_update(stat, mtxp);
	NNI_LIST_FOREACH (&stat->s_children, child) {
		stat_update_tree(child, mtxp);
	}
}